

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O0

void __thiscall scheduler_tests::manythreads::test_method(manythreads *this)

{
  bool bVar1;
  strong_ordering sVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t_00;
  long in_FS_OFFSET;
  int i_4;
  thread *thread;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  int whichCounter_1;
  int i_3;
  int i_2;
  int i_1;
  int whichCounter;
  int i;
  size_t nTasks;
  int counterSum;
  iterator __end1;
  iterator __begin1;
  Function f_1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tReschedule_1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t_1;
  vector<std::thread,_std::allocator<std::thread>_> microThreads;
  Function f;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tReschedule;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t;
  time_point last;
  time_point first;
  time_point now;
  time_point start;
  anon_class_1_0_00000001 randomDelta;
  anon_class_1_0_00000001 randomMsec;
  anon_class_1_0_00000001 zeroToNine;
  FastRandomContext rng;
  int counter [10];
  mutex counterMutex [10];
  CScheduler microTasks;
  char *in_stack_fffffffffffff648;
  CScheduler *in_stack_fffffffffffff650;
  FastRandomContext *in_stack_fffffffffffff658;
  _Bind<void_(*(std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>))(CScheduler_&,_std::mutex_&,_int_&,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)>
  *in_stack_fffffffffffff660;
  function<void_()> *in_stack_fffffffffffff668;
  undefined7 in_stack_fffffffffffff670;
  undefined1 in_stack_fffffffffffff677;
  lazy_ostream *in_stack_fffffffffffff678;
  Function *in_stack_fffffffffffff680;
  const_string *file;
  undefined7 in_stack_fffffffffffff688;
  undefined1 in_stack_fffffffffffff68f;
  time_point *in_stack_fffffffffffff690;
  CScheduler *in_stack_fffffffffffff698;
  time_point in_stack_fffffffffffff6b8;
  undefined1 *puVar3;
  undefined1 *local_880;
  int local_874;
  int local_858;
  int local_854;
  int local_850;
  int local_844;
  undefined1 local_818 [16];
  undefined1 local_808 [64];
  const_string local_7c8 [2];
  lazy_ostream local_7a8 [2];
  assertion_result local_788 [2];
  int local_74c;
  thread *local_748;
  thread *local_740;
  rep local_738;
  int local_70c;
  int *local_708;
  mutex *local_700;
  CScheduler *local_6f8;
  code *local_6f0;
  int local_694;
  undefined1 local_688 [48];
  undefined8 local_658;
  undefined8 local_638;
  undefined4 local_62c;
  __pthread_internal_list *local_620;
  code *local_618;
  _Base_ptr local_610;
  const_string local_5d8 [2];
  lazy_ostream local_5b8 [2];
  assertion_result local_590 [2];
  const_string local_558 [2];
  lazy_ostream local_538 [2];
  assertion_result local_510 [2];
  const_string local_4d8 [2];
  lazy_ostream local_4b8 [2];
  assertion_result local_498 [2];
  rep local_460;
  int local_434;
  int *local_430;
  mutex *local_428;
  CScheduler *local_420;
  code *local_418;
  int local_3bc;
  undefined1 local_3b0 [64];
  lazy_ostream local_370 [2];
  assertion_result local_350 [3];
  undefined8 local_308;
  undefined8 local_300;
  undefined1 local_2f3;
  undefined1 local_2f2;
  undefined1 local_2f1;
  int local_268 [12];
  undefined1 local_238 [400];
  undefined1 auStack_a8 [8];
  __pthread_internal_list local_a0 [9];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CScheduler::CScheduler((CScheduler *)in_stack_fffffffffffff648);
  local_880 = local_238;
  puVar3 = auStack_a8;
  do {
    std::mutex::mutex((mutex *)in_stack_fffffffffffff648);
    local_880 = local_880 + 0x28;
  } while (local_880 != puVar3);
  local_268[4] = 0;
  local_268[5] = 0;
  local_268[6] = 0;
  local_268[7] = 0;
  local_268[0] = 0;
  local_268[1] = 0;
  local_268[2] = 0;
  local_268[3] = 0;
  local_268[8] = 0;
  local_268[9] = 0;
  FastRandomContext::FastRandomContext
            (in_stack_fffffffffffff658,SUB81((ulong)in_stack_fffffffffffff650 >> 0x38,0));
  local_2f1 = 0;
  local_2f2 = 0;
  local_2f3 = 0;
  local_308 = std::chrono::_V2::steady_clock::now();
  local_300 = local_308;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffff648);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffff648);
  CScheduler::getQueueInfo
            (in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (time_point *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (const_string *)in_stack_fffffffffffff680,(size_t)in_stack_fffffffffffff678,
               (const_string *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff658,
               SUB81((ulong)in_stack_fffffffffffff650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff650,
               (basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    in_stack_fffffffffffff648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_350,local_370,(const_string *)(local_3b0 + 0x20),0x38,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff648);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (local_844 = 0; local_844 < 100; local_844 = local_844 + 1) {
    local_3b0._12_4_ =
         test_method::anon_class_1_0_00000001::operator()
                   ((anon_class_1_0_00000001 *)in_stack_fffffffffffff658,
                    (FastRandomContext *)in_stack_fffffffffffff650);
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff648,
               (int *)0x9dd6c2);
    local_3b0._24_8_ =
         std::chrono::operator+
                   ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_fffffffffffff650,
                    (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff648);
    local_3bc = test_method::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)in_stack_fffffffffffff658,
                           (FastRandomContext *)in_stack_fffffffffffff650);
    local_3bc = local_3bc + 500;
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff648,
               (int *)0x9dd739);
    local_3b0._0_8_ =
         std::chrono::operator+
                   ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_fffffffffffff650,
                    (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff648);
    test_method::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_fffffffffffff658,
               (FastRandomContext *)in_stack_fffffffffffff650);
    local_418 = microTask;
    local_420 = (CScheduler *)std::ref<CScheduler>(in_stack_fffffffffffff650);
    local_428 = (mutex *)std::ref<std::mutex>((mutex *)in_stack_fffffffffffff650);
    local_430 = (int *)std::ref<int>((int *)in_stack_fffffffffffff650);
    local_434 = test_method::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)in_stack_fffffffffffff658,
                           (FastRandomContext *)in_stack_fffffffffffff650);
    in_stack_fffffffffffff648 = local_3b0;
    std::
    bind<void(*)(CScheduler&,std::mutex&,int&,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>),std::reference_wrapper<CScheduler>,std::reference_wrapper<std::mutex>,std::reference_wrapper<int>,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&>
              ((_func_void_CScheduler_ptr_mutex_ptr_int_ptr_int_time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                **)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670),
               (reference_wrapper<CScheduler> *)in_stack_fffffffffffff668,
               (reference_wrapper<std::mutex> *)in_stack_fffffffffffff660,
               (reference_wrapper<int> *)in_stack_fffffffffffff658,(int *)in_stack_fffffffffffff650,
               in_stack_fffffffffffff690);
    std::function<void()>::
    function<std::_Bind<void(*(std::reference_wrapper<CScheduler>,std::reference_wrapper<std::mutex>,std::reference_wrapper<int>,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>))(CScheduler&,std::mutex&,int&,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)>,void>
              (in_stack_fffffffffffff668,in_stack_fffffffffffff660);
    std::function<void_()>::function
              (in_stack_fffffffffffff668,(function<void_()> *)in_stack_fffffffffffff660);
    local_460 = local_3b0._24_8_;
    CScheduler::schedule
              ((CScheduler *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               in_stack_fffffffffffff680,in_stack_fffffffffffff6b8);
    std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffff648);
    std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffff648);
  }
  CScheduler::getQueueInfo
            (in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (time_point *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (const_string *)in_stack_fffffffffffff680,(size_t)in_stack_fffffffffffff678,
               (const_string *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff658,
               SUB81((ulong)in_stack_fffffffffffff650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff650,
               (basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    in_stack_fffffffffffff648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_498,local_4b8,local_4d8,0x44,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff648);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (const_string *)in_stack_fffffffffffff680,(size_t)in_stack_fffffffffffff678,
               (const_string *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670));
    sVar2 = std::chrono::
            operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffff650,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffff648);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_fffffffffffff648,(__unspec *)0x9ddbdd);
    std::operator<(sVar2._M_value);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff658,
               SUB81((ulong)in_stack_fffffffffffff650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff650,
               (basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    in_stack_fffffffffffff648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_510,local_538,local_558,0x45,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff648);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (const_string *)in_stack_fffffffffffff680,(size_t)in_stack_fffffffffffff678,
               (const_string *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670));
    sVar2 = std::chrono::
            operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffff650,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffff648);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_fffffffffffff648,(__unspec *)0x9ddd6f);
    std::operator>(sVar2._M_value);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff658,
               SUB81((ulong)in_stack_fffffffffffff650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff650,
               (basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    in_stack_fffffffffffff648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_590,local_5b8,local_5d8,0x46,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff648);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffff648);
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
             (size_type)in_stack_fffffffffffff680);
  for (local_850 = 0; local_850 < 5; local_850 = local_850 + 1) {
    local_618 = CScheduler::serviceQueue;
    local_610 = (_Base_ptr)0x0;
    local_620 = local_a0;
    std::bind<void(CScheduler::*)(),CScheduler*>
              ((offset_in_CScheduler_to_subr *)in_stack_fffffffffffff650,
               (CScheduler **)in_stack_fffffffffffff648);
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<std::_Bind<void(CScheduler::*(CScheduler*))()>>
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffff668,
               (_Bind<void_(CScheduler::*(CScheduler_*))()> *)in_stack_fffffffffffff660);
  }
  local_62c = 600;
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
            ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff648,(int *)0x9de050)
  ;
  UninterruptibleSleep((microseconds *)in_stack_fffffffffffff648);
  local_638 = std::chrono::_V2::steady_clock::now();
  local_308 = local_638;
  for (local_854 = 0; local_854 < 5; local_854 = local_854 + 1) {
    local_688._40_8_ = CScheduler::serviceQueue;
    local_658._0_1_ = (condition_variable)0x0;
    local_658._1_7_ = 0;
    local_688._32_8_ = local_a0;
    std::bind<void(CScheduler::*)(),CScheduler*>
              ((offset_in_CScheduler_to_subr *)in_stack_fffffffffffff650,
               (CScheduler **)in_stack_fffffffffffff648);
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<std::_Bind<void(CScheduler::*(CScheduler*))()>>
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffff668,
               (_Bind<void_(CScheduler::*(CScheduler_*))()> *)in_stack_fffffffffffff660);
  }
  for (local_858 = 0; local_858 < 100; local_858 = local_858 + 1) {
    local_688._12_4_ =
         test_method::anon_class_1_0_00000001::operator()
                   ((anon_class_1_0_00000001 *)in_stack_fffffffffffff658,
                    (FastRandomContext *)in_stack_fffffffffffff650);
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff648,
               (int *)0x9de15d);
    t_00 = std::chrono::operator+
                     ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_fffffffffffff650,
                      (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff648);
    local_688._24_8_ = t_00;
    local_694 = test_method::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)in_stack_fffffffffffff658,
                           (FastRandomContext *)in_stack_fffffffffffff650);
    local_694 = local_694 + 500;
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff648,
               (int *)0x9de1c8);
    local_688._0_8_ =
         std::chrono::operator+
                   ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_fffffffffffff650,
                    (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff648);
    test_method::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_fffffffffffff658,
               (FastRandomContext *)in_stack_fffffffffffff650);
    local_6f0 = microTask;
    local_6f8 = (CScheduler *)std::ref<CScheduler>(in_stack_fffffffffffff650);
    local_700 = (mutex *)std::ref<std::mutex>((mutex *)in_stack_fffffffffffff650);
    local_708 = (int *)std::ref<int>((int *)in_stack_fffffffffffff650);
    local_70c = test_method::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)in_stack_fffffffffffff658,
                           (FastRandomContext *)in_stack_fffffffffffff650);
    in_stack_fffffffffffff648 = local_688;
    std::
    bind<void(*)(CScheduler&,std::mutex&,int&,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>),std::reference_wrapper<CScheduler>,std::reference_wrapper<std::mutex>,std::reference_wrapper<int>,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&>
              ((_func_void_CScheduler_ptr_mutex_ptr_int_ptr_int_time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                **)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670),
               (reference_wrapper<CScheduler> *)in_stack_fffffffffffff668,
               (reference_wrapper<std::mutex> *)in_stack_fffffffffffff660,
               (reference_wrapper<int> *)in_stack_fffffffffffff658,(int *)in_stack_fffffffffffff650,
               in_stack_fffffffffffff690);
    std::function<void()>::
    function<std::_Bind<void(*(std::reference_wrapper<CScheduler>,std::reference_wrapper<std::mutex>,std::reference_wrapper<int>,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>))(CScheduler&,std::mutex&,int&,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)>,void>
              (in_stack_fffffffffffff668,in_stack_fffffffffffff660);
    std::function<void_()>::function
              (in_stack_fffffffffffff668,(function<void_()> *)in_stack_fffffffffffff660);
    local_738 = local_688._24_8_;
    CScheduler::schedule
              ((CScheduler *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               in_stack_fffffffffffff680,(time_point)t_00.__d.__r);
    std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffff648);
    std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffff648);
  }
  CScheduler::StopWhenDrained(in_stack_fffffffffffff650);
  local_740 = (thread *)
              std::vector<std::thread,_std::allocator<std::thread>_>::begin
                        ((vector<std::thread,_std::allocator<std::thread>_> *)
                         in_stack_fffffffffffff650);
  local_748 = (thread *)
              std::vector<std::thread,_std::allocator<std::thread>_>::end
                        ((vector<std::thread,_std::allocator<std::thread>_> *)
                         in_stack_fffffffffffff650);
  while (bVar1 = __gnu_cxx::
                 operator==<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                           ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                             *)in_stack_fffffffffffff658,
                            (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                             *)in_stack_fffffffffffff650), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
               *)in_stack_fffffffffffff648);
    bVar1 = std::thread::joinable((thread *)in_stack_fffffffffffff648);
    if (bVar1) {
      std::thread::join();
    }
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                *)in_stack_fffffffffffff648);
  }
  local_74c = 0;
  for (local_874 = 0; local_874 < 10; local_874 = local_874 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
                 (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
                 (const_string *)in_stack_fffffffffffff680,(size_t)in_stack_fffffffffffff678,
                 (const_string *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff658,
                 SUB81((ulong)in_stack_fffffffffffff650 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
                 (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff650,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff648);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
                 (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
      in_stack_fffffffffffff648 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_788,local_7a8,local_7c8,0x67,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff648);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff648);
      in_stack_fffffffffffff68f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff68f);
    local_74c = local_268[local_874] + local_74c;
  }
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),file
               ,(size_t)in_stack_fffffffffffff678,
               (const_string *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670));
    in_stack_fffffffffffff678 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff650,(char (*) [1])in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    in_stack_fffffffffffff658 = (FastRandomContext *)0x1c1fdc1;
    in_stack_fffffffffffff650 = (CScheduler *)&stack0xfffffffffffff7e4;
    in_stack_fffffffffffff648 = "counterSum";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_808,local_818,0x6a,1,2,&local_74c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff648);
    in_stack_fffffffffffff677 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff677);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffff658);
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_fffffffffffff648);
  CScheduler::~CScheduler((CScheduler *)in_stack_fffffffffffff648);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(manythreads)
{
    // Stress test: hundreds of microsecond-scheduled tasks,
    // serviced by 10 threads.
    //
    // So... ten shared counters, which if all the tasks execute
    // properly will sum to the number of tasks done.
    // Each task adds or subtracts a random amount from one of the
    // counters, and then schedules another task 0-1000
    // microseconds in the future to subtract or add from
    // the counter -random_amount+1, so in the end the shared
    // counters should sum to the number of initial tasks performed.
    CScheduler microTasks;

    std::mutex counterMutex[10];
    int counter[10] = { 0 };
    FastRandomContext rng{/*fDeterministic=*/true};
    auto zeroToNine = [](FastRandomContext& rc) -> int { return rc.randrange(10); }; // [0, 9]
    auto randomMsec = [](FastRandomContext& rc) -> int { return -11 + (int)rc.randrange(1012); }; // [-11, 1000]
    auto randomDelta = [](FastRandomContext& rc) -> int { return -1000 + (int)rc.randrange(2001); }; // [-1000, 1000]

    auto start = std::chrono::steady_clock::now();
    auto now = start;
    std::chrono::steady_clock::time_point first, last;
    size_t nTasks = microTasks.getQueueInfo(first, last);
    BOOST_CHECK(nTasks == 0);

    for (int i = 0; i < 100; ++i) {
        auto t = now + std::chrono::microseconds(randomMsec(rng));
        auto tReschedule = now + std::chrono::microseconds(500 + randomMsec(rng));
        int whichCounter = zeroToNine(rng);
        CScheduler::Function f = std::bind(&microTask, std::ref(microTasks),
                                             std::ref(counterMutex[whichCounter]), std::ref(counter[whichCounter]),
                                             randomDelta(rng), tReschedule);
        microTasks.schedule(f, t);
    }
    nTasks = microTasks.getQueueInfo(first, last);
    BOOST_CHECK(nTasks == 100);
    BOOST_CHECK(first < last);
    BOOST_CHECK(last > now);

    // As soon as these are created they will start running and servicing the queue
    std::vector<std::thread> microThreads;
    microThreads.reserve(10);
    for (int i = 0; i < 5; i++)
        microThreads.emplace_back(std::bind(&CScheduler::serviceQueue, &microTasks));

    UninterruptibleSleep(std::chrono::microseconds{600});
    now = std::chrono::steady_clock::now();

    // More threads and more tasks:
    for (int i = 0; i < 5; i++)
        microThreads.emplace_back(std::bind(&CScheduler::serviceQueue, &microTasks));
    for (int i = 0; i < 100; i++) {
        auto t = now + std::chrono::microseconds(randomMsec(rng));
        auto tReschedule = now + std::chrono::microseconds(500 + randomMsec(rng));
        int whichCounter = zeroToNine(rng);
        CScheduler::Function f = std::bind(&microTask, std::ref(microTasks),
                                             std::ref(counterMutex[whichCounter]), std::ref(counter[whichCounter]),
                                             randomDelta(rng), tReschedule);
        microTasks.schedule(f, t);
    }

    // Drain the task queue then exit threads
    microTasks.StopWhenDrained();
    // wait until all the threads are done
    for (auto& thread: microThreads) {
        if (thread.joinable()) thread.join();
    }

    int counterSum = 0;
    for (int i = 0; i < 10; i++) {
        BOOST_CHECK(counter[i] != 0);
        counterSum += counter[i];
    }
    BOOST_CHECK_EQUAL(counterSum, 200);
}